

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

void qcc_generate_transform(qcc_generator_ptr self,void *data)

{
  undefined1 local_a8 [8];
  uint8_t tmp [128];
  qcc_generator_transform *transform;
  void *data_local;
  qcc_generator_ptr self_local;
  
  if ((self[1].context)->error < (char *)0x81) {
    qcc_generate((qcc_generator_ptr)self[1].context,local_a8);
    (*(code *)self[1].type_size)
              (self[1].generate,local_a8,(self[1].context)->error,data,self->type_size);
    return;
  }
  __assert_fail("transform->src_gen->type_size <= 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/src/generator.c"
                ,0x79,"void qcc_generate_transform(qcc_generator_ptr, void *)");
}

Assistant:

static void qcc_generate_transform(qcc_generator_ptr self, void *data)
{
    struct qcc_generator_transform *transform =
        (struct qcc_generator_transform *)self;

    uint8_t tmp[128];
    assert(transform->src_gen->type_size <= 128);
    qcc_generate(transform->src_gen, tmp);
    transform->transform(transform->params, tmp, transform->src_gen->type_size,
                         data, self->type_size);
}